

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

byte * __thiscall
TTD::SlabAllocatorBase<0>::SlabAllocateLargeBlockSize<false>
          (SlabAllocatorBase<0> *this,size_t requestedBytes)

{
  HeapAllocator *this_00;
  uchar *alloc;
  LargeSlabBlock *pLVar1;
  uint uVar2;
  undefined1 local_40 [8];
  TrackAllocData data;
  ulong byteSize;
  
  if (requestedBytes < 0x1001) {
    TTDAbort_unrecoverable_error("Don\'t allocate small requests in the large pool.");
  }
  uVar2 = (int)requestedBytes + 0x2bU & 0xfffffffc;
  byteSize = (ulong)uVar2;
  if (requestedBytes + 0x28 <= byteSize) {
    if (this->m_reserveActiveBytes == 0) {
      local_40 = (undefined1  [8])&unsigned_char::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_3eb50dd;
      data.filename._0_4_ = 0x24b;
      data.plusSize = byteSize;
      this_00 = Memory::HeapAllocator::TrackAllocInfo
                          (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_40);
      alloc = (uchar *)Memory::HeapAllocator::AllocT<true>(this_00,byteSize);
      pLVar1 = (LargeSlabBlock *)TTD_MEM_ALLOC_CHECK<unsigned_char>(alloc);
      pLVar1->BlockData = (byte *)(pLVar1 + 1);
      pLVar1->TotalBlockSize = uVar2;
      pLVar1->Previous = this->m_largeBlockList;
      pLVar1->Next = (LargeSlabBlock *)0x0;
      pLVar1->MetaDataSential = 0;
      this->m_reserveActiveBytes = uVar2;
      this->m_reserveActiveLargeBlock = pLVar1;
      return (byte *)(pLVar1 + 1);
    }
    TTDAbort_unrecoverable_error("Don\'t double allocate memory.");
  }
  TTDAbort_unrecoverable_error("We can never allocate a block this big with the slab allocator!!");
}

Assistant:

byte* SlabAllocateLargeBlockSize(size_t requestedBytes)
        {
            TTDAssert(requestedBytes > TTD_SLAB_LARGE_BLOCK_SIZE, "Don't allocate small requests in the large pool.");

            uint32 desiredsize = TTD_WORD_ALIGN_ALLOC_SIZE(requestedBytes + TTD_LARGE_SLAB_BLOCK_SIZE); //make alloc size word aligned
            TTDAssert((desiredsize % 4 == 0) & (desiredsize >= (requestedBytes + TTD_LARGE_SLAB_BLOCK_SIZE)), "We can never allocate a block this big with the slab allocator!!");

            TTDAssert(this->m_reserveActiveBytes == 0, "Don't double allocate memory.");

            byte* tmp = TT_HEAP_ALLOC_ARRAY(byte, desiredsize);

            LargeSlabBlock* newBlock = (LargeSlabBlock*)tmp;
            newBlock->BlockData = (tmp + TTD_LARGE_SLAB_BLOCK_SIZE);

            newBlock->TotalBlockSize = desiredsize;
            newBlock->Previous = this->m_largeBlockList;
            newBlock->Next = nullptr;

            newBlock->MetaDataSential = 0;

            if (commit)
            {
                this->CommitLargeBlockAllocation(newBlock, desiredsize);
            }
            else
            {
                this->m_reserveActiveBytes = desiredsize;
                this->m_reserveActiveLargeBlock = newBlock;
            }

            return newBlock->BlockData;
        }